

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O3

void __thiscall GoState<3U,_4U>::do_move(GoState<3U,_4U> *this,Move move)

{
  int iVar1;
  uint uVar2;
  char *expr;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  pieces;
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_60;
  
  this->depth = this->depth + 1;
  uVar3 = 3 - this->player_to_move;
  if (move == -1) {
    this->player_to_move = uVar3;
    return;
  }
  if (0xb < (uint)move) {
    MCTS::assertion_failed
              ("ind >= 0 && ind < M * N",
               "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/go.h"
               ,0x29);
  }
  uVar4 = (uint)move >> 2;
  uVar5 = move & 3;
  iVar1 = (*this->_vptr_GoState[5])(this,(ulong)uVar4,(ulong)uVar5);
  if ((char)iVar1 == '\0') {
    MCTS::assertion_failed
              ("is_move_possible(i, j)",
               "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/go.h"
               ,0xc2);
  }
  this->board[uVar4][uVar5] = (uchar)this->player_to_move;
  uVar2 = (*this->_vptr_GoState[4])(this);
  this->previous_board_hash_value = uVar2;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&this->all_hash_values,&this->previous_board_hash_value);
  if ((uint)move < 4) {
LAB_00141bfe:
    if (uVar3 == this->board[(ulong)uVar4 + 1][uVar5]) {
      (*this->_vptr_GoState[10])(this,(ulong)(uVar4 + 1),(ulong)uVar5);
    }
  }
  else {
    if (uVar3 == this->board[uVar4 - 1][uVar5]) {
      (*this->_vptr_GoState[10])(this,(ulong)(uVar4 - 1),(ulong)uVar5);
    }
    if ((uint)move < 8) goto LAB_00141bfe;
  }
  if (uVar5 != 0) {
    if (uVar3 == this->board[uVar4][uVar5 - 1]) {
      (*this->_vptr_GoState[10])(this,(ulong)uVar4);
    }
    if (uVar5 == 3) goto LAB_00141c87;
  }
  if (uVar3 == this->board[uVar4][(ulong)uVar5 + 1]) {
    (*this->_vptr_GoState[10])(this,(ulong)uVar4,(ulong)(uVar5 + 1));
  }
LAB_00141c87:
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this->player_to_move == (uint)this->board[uVar4][uVar5]) {
    iVar1 = (*this->_vptr_GoState[9])(this,(ulong)uVar4,(ulong)uVar5,&local_60);
    if ((char)iVar1 != '\0') {
      this->player_to_move = uVar3;
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::~_Rb_tree(&local_60);
      return;
    }
    iVar1 = 0xdc;
    expr = "is_alive(i, j, &pieces)";
  }
  else {
    iVar1 = 0xdb;
    expr = "board[i][j] == player_to_move";
  }
  MCTS::assertion_failed
            (expr,
             "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/go.h"
             ,iVar1);
}

Assistant:

virtual void do_move(Move move)
	{
		depth++;

		int opponent = 3 - player_to_move;

		if (move == pass) {
			player_to_move = opponent;
			return;
		}

		int i,j;
		std::tie(i, j) = ind_to_ij(move);
		attest(is_move_possible(i, j));

		board[i][j] = player_to_move;

		// We save the hash values before all captures as this is way easier
		// to check.
		previous_board_hash_value = compute_hash_value();
		all_hash_values.insert(previous_board_hash_value);

		// Check for the killing of any opposing stones.
		if (i > 0 && board[i - 1][j] == opponent) {
			check_alive(i - 1, j);
		}
		if (i < M - 1 && board[i + 1][j] == opponent) {
			check_alive(i + 1, j);
		}
		if (j > 0 && board[i][j - 1] == opponent) {
			check_alive(i, j - 1);
		}
		if (j < N - 1 && board[i][j + 1] == opponent) {
			check_alive(i, j + 1);
		}

		std::set<std::pair<int, int>> pieces;
		// Now the played stone must be alive.
		attest(board[i][j] == player_to_move);
		attest(is_alive(i, j, &pieces));

		// Next player
		player_to_move = opponent;
	}